

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::CloseFile(BamMultiReaderPrivate *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string currentError;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8;
  long *local_88;
  ulong local_80;
  long local_78;
  long lStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (this->m_errorString)._M_string_length = 0;
  *(this->m_errorString)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,1,filename,(allocator_type *)local_c8);
  bVar3 = CloseFiles(this,&local_48);
  if (!bVar3) {
    local_c8[0] = local_b8;
    pcVar2 = (this->m_errorString)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar2,pcVar2 + (this->m_errorString)._M_string_length);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"error while closing file: ","");
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_68,(ulong)(filename->_M_dataplus)._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_78 = *plVar5;
      lStack_70 = plVar4[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar5;
      local_88 = (long *)*plVar4;
    }
    local_80 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_80,0,'\x01');
    paVar1 = &local_e8.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8.field_2._8_8_ = plVar4[3];
      local_e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8[0]);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8.field_2._8_8_ = plVar4[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_a8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"BamMultiReader::CloseFile","");
    SetErrorString(this,&local_e8,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar3;
}

Assistant:

bool BamMultiReaderPrivate::CloseFile(const std::string& filename)
{

    m_errorString.clear();

    std::vector<std::string> filenames(1, filename);
    if (CloseFiles(filenames)) {
        return true;
    } else {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("error while closing file: ") + filename + '\n' + currentError;
        SetErrorString("BamMultiReader::CloseFile", message);
        return false;
    }
}